

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O3

pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
* __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::insert
          (pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
           *__return_storage_ptr__,
          Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          int *key,int *payload)

{
  longlong *plVar1;
  TraversalNode *pTVar2;
  TraversalNode *pTVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  byte bVar12;
  AlexNode<int,_int> **ppAVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  allocator<std::pair<int,_int>_> *paVar16;
  TraversalNode *pTVar17;
  int iVar18;
  uint uVar19;
  uint fanout_tree_depth;
  int iVar20;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *pAVar21;
  pair<int,_int> pVar22;
  long lVar23;
  long lVar24;
  model_node_type *pmVar25;
  model_node_type *node;
  pointer pFVar26;
  int iVar27;
  ulong uVar28;
  pointer pFVar29;
  self_type *unaff_R13;
  int *piVar30;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this_00;
  uint uVar31;
  pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
  *ppVar32;
  undefined1 auVar33 [16];
  undefined8 in_XMM0_Qa;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined8 in_XMM8_Qb;
  model_node_type *parent;
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
  traversal_path;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
  used_fanout_tree_nodes;
  model_node_type *local_c0;
  undefined1 local_b8 [8];
  TraversalNode *pTStack_b0;
  pointer local_a8;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> local_98;
  int *local_80;
  int local_74;
  pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
  *local_70;
  int *local_68;
  ulong local_60;
  double local_58;
  double local_50;
  Iterator local_48;
  
  iVar20 = *key;
  iVar27 = (this->istats_).key_domain_max_;
  local_68 = payload;
  if (iVar27 < iVar20) {
    iVar18 = (this->istats_).num_keys_above_key_domain;
    uVar31 = iVar18 + 1;
    (this->istats_).num_keys_above_key_domain = uVar31;
    if (3 < iVar18 && this->root_node_->is_leaf_ == false) {
      iVar18 = (this->stats_).num_keys / (this->istats_).num_keys_at_last_right_domain_resize;
LAB_001428dc:
      if ((999 < uVar31) || (iVar18 * 2 + -2 <= (int)uVar31)) {
        expand_root(this,*key,iVar20 <= iVar27);
      }
    }
  }
  else if (iVar20 < (this->istats_).key_domain_min_) {
    iVar18 = (this->istats_).num_keys_below_key_domain;
    uVar31 = iVar18 + 1;
    (this->istats_).num_keys_below_key_domain = uVar31;
    if (3 < iVar18 && this->root_node_->is_leaf_ == false) {
      iVar18 = (this->stats_).num_keys / (this->istats_).num_keys_at_last_left_domain_resize;
      goto LAB_001428dc;
    }
  }
  pAVar21 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
             *)this->root_node_;
  this_00 = pAVar21;
  if ((pAVar21->super_AlexNode<int,_int>).is_leaf_ == false) {
    iVar20 = *key;
    auVar33._8_8_ = 0x7fffffffffffffff;
    auVar33._0_8_ = 0x7fffffffffffffff;
    lVar23 = (this->stats_).num_node_lookups;
    auVar34._0_8_ = (double)iVar20;
    auVar34._8_8_ = in_XMM0_Qa;
    do {
      auVar44._8_8_ = 0;
      auVar44._0_8_ = (pAVar21->super_AlexNode<int,_int>).model_.a_;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (pAVar21->super_AlexNode<int,_int>).model_.b_;
      auVar6 = vfmadd213sd_fma(auVar44,auVar34,auVar6);
      uVar31 = *(int *)&pAVar21->allocator_ - 1;
      dVar43 = auVar6._0_8_;
      uVar19 = ~((int)dVar43 >> 0x1f) & (int)dVar43;
      if ((int)uVar19 <= (int)uVar31) {
        uVar31 = uVar19;
      }
      pAVar21 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 *)(&(pAVar21->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[(int)uVar31];
      bVar11 = (pAVar21->super_AlexNode<int,_int>).is_leaf_;
      if (bVar11 == true) {
        lVar23 = lVar23 + (pAVar21->super_AlexNode<int,_int>).level_;
        auVar44 = vcvtdq2pd_avx(ZEXT416((uint)(int)(dVar43 + 0.5)));
        (this->stats_).num_node_lookups = lVar23;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = dVar43 - auVar44._0_8_;
        auVar6 = vandpd_avx(auVar45,auVar33);
        this_00 = pAVar21;
        if (dVar43 * 2.220446049250313e-15 < auVar6._0_8_) break;
        if (auVar44._0_8_ <= dVar43) {
          unaff_R13 = pAVar21->prev_leaf_;
          if (unaff_R13 == (self_type *)0x0) break;
          uVar28 = (ulong)(uint)unaff_R13->data_capacity_;
          do {
            if ((int)uVar28 < 1) {
              iVar27 = -0x80000000;
              goto LAB_00142a23;
            }
            uVar31 = (int)uVar28 - 1;
            uVar28 = (ulong)uVar31;
          } while ((unaff_R13->bitmap_[uVar31 >> 6] >> (uVar28 & 0x3f) & 1) == 0);
          iVar27 = unaff_R13->key_slots_[uVar31];
LAB_00142a23:
          if (iVar27 < iVar20) {
            unaff_R13 = pAVar21;
          }
        }
        else {
          unaff_R13 = pAVar21->next_leaf_;
          if (unaff_R13 ==
              (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
               *)0x0) break;
          iVar27 = 0x7fffffff;
          if (0 < unaff_R13->data_capacity_) {
            uVar28 = 0;
            do {
              if ((unaff_R13->bitmap_[uVar28 >> 6 & 0x3ffffff] >> (uVar28 & 0x3f) & 1) != 0) {
                iVar27 = unaff_R13->key_slots_[uVar28];
                break;
              }
              uVar28 = uVar28 + 1;
            } while (unaff_R13->data_capacity_ != (int)uVar28);
          }
          if (iVar20 < iVar27) {
            unaff_R13 = pAVar21;
          }
        }
      }
      this_00 = unaff_R13;
    } while (bVar11 == false);
  }
  local_80 = key;
  local_70 = __return_storage_ptr__;
  pVar22 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
           insert(this_00,key,local_68);
  uVar28 = (ulong)pVar22 >> 0x20;
  iVar20 = pVar22.first;
  ppVar32 = local_70;
  if (iVar20 == 0) goto LAB_0014300b;
  if (iVar20 == -1) {
    pTStack_b0 = (TraversalNode *)((ulong)pVar22 >> 0x20);
    local_a8 = (pointer)0x0;
    local_b8 = (undefined1  [8])this_00;
    Iterator::initialize((Iterator *)local_b8);
    (local_70->first).cur_leaf_ = (data_node_type *)local_b8;
    *(TraversalNode **)&(local_70->first).cur_idx_ = pTStack_b0;
    (local_70->first).cur_bitmap_data_ = (uint64_t)local_a8;
    local_70->second = false;
    return local_70;
  }
  local_b8 = (undefined1  [8])0x0;
  pTStack_b0 = (TraversalNode *)0x0;
  local_a8 = (TraversalNode *)0x0;
  local_98.super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this->superroot_;
  iVar27 = *local_80;
  local_98.super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_98.
                        super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  local_60 = uVar28;
  std::
  vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
  ::
  _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>
            ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
              *)local_b8,(iterator)0x0,(TraversalNode *)&local_98);
  pFVar29 = (pointer)this->root_node_;
  if (*(bool *)&pFVar29->cost == true) {
    local_c0 = pTStack_b0[-1].node;
LAB_00142bfc:
    do {
      lVar23 = std::chrono::_V2::system_clock::now();
      piVar30 = &(this->stats_).num_expand_and_scales;
      *piVar30 = *piVar30 + this_00->num_resizes_;
      if (local_c0 == this->superroot_) {
        update_superroot_key_domain(this);
      }
      auVar36._8_8_ = 0;
      auVar36._0_8_ = (local_c0->super_AlexNode<int,_int>).model_.a_;
      fanout_tree_depth = 1;
      auVar40._0_8_ = (double)*local_80;
      auVar40._8_8_ = in_XMM8_Qb;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (local_c0->super_AlexNode<int,_int>).model_.b_;
      auVar34 = vfmadd213sd_fma(auVar40,auVar36,auVar8);
      uVar31 = local_c0->num_children_ - 1;
      local_98.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar19 = ~((int)auVar34._0_8_ >> 0x1f) & (int)auVar34._0_8_;
      if ((int)uVar19 <= (int)uVar31) {
        uVar31 = uVar19;
      }
      iVar20 = (this->experimental_params_).splitting_policy_method;
      iVar27 = pVar22.first;
      if (iVar27 < 2 && iVar20 != 0) {
        if (iVar20 == 1) {
          iVar20 = 2;
        }
        else {
          if (iVar20 != 2) goto LAB_00142cb0;
          iVar20 = (this->derived_params_).max_fanout;
        }
        fanout_tree_depth =
             fanout_tree::find_best_fanout_existing_node<int,int>
                       (local_c0,uVar31,(this->stats_).num_keys,&local_98,iVar20);
      }
LAB_00142cb0:
      lVar24 = std::chrono::_V2::system_clock::now();
      piVar30 = local_80;
      (this->stats_).cost_computation_time =
           (double)(lVar24 - lVar23) + (this->stats_).cost_computation_time;
      if (fanout_tree_depth == 0) {
        auVar37._0_8_ = (double)this_00->num_inserts_;
        uVar4 = this_00->num_right_out_of_bounds_inserts_;
        uVar5 = this_00->num_left_out_of_bounds_inserts_;
        auVar9._4_4_ = uVar5;
        auVar9._0_4_ = uVar4;
        auVar9._8_8_ = 0;
        auVar34 = vcvtdq2pd_avx(auVar9);
        auVar37._8_8_ = auVar37._0_8_;
        auVar34 = vdivpd_avx(auVar34,auVar37);
        auVar14._8_8_ = 0x3feccccccccccccd;
        auVar14._0_8_ = 0x3feccccccccccccd;
        uVar28 = vcmppd_avx512vl(auVar34,auVar14,0xe);
        AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
        resize(this_00,0.6,true,(bool)((byte)(uVar28 & 3) & 1),SUB81((uVar28 & 3) >> 1,0));
        (this_00->super_AlexNode<int,_int>).cost_ =
             (local_98.
              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
              ._M_impl.super__Vector_impl_data._M_start)->cost;
        paVar16 = (allocator<std::pair<int,_int>_> *)
                  (local_98.
                   super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start)->expected_avg_shifts;
        this_00->expected_avg_exp_search_iterations_ =
             (local_98.
              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
              ._M_impl.super__Vector_impl_data._M_start)->expected_avg_search_iterations;
        this_00->expected_avg_shifts_ = (double)paVar16;
        this_00->num_shifts_ = 0;
        this_00->num_exp_search_iterations_ = 0;
        *(undefined8 *)((long)&this_00->num_exp_search_iterations_ + 4) = 0;
        this_00->num_inserts_ = 0;
        this_00->num_resizes_ = 0;
        piVar30 = &(this->stats_).num_expand_and_retrains;
        *piVar30 = *piVar30 + 1;
        piVar30 = local_80;
      }
      else {
        if ((this->experimental_params_).allow_splitting_upwards == true) {
          if ((this->experimental_params_).splitting_policy_method == 2) {
            __assert_fail("experimental_params_.splitting_policy_method != 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                          ,0x4bc,
                          "std::pair<Iterator, bool> alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::insert(const T &, const P &) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                         );
          }
          iVar20 = best_split_propagation
                             (this,(vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                                    *)local_b8,false);
          if ((this->superroot_->super_AlexNode<int,_int>).level_ < iVar20) {
            split_upwards(this,*piVar30,iVar20,
                          (vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                           *)local_b8,iVar27 == 3,&local_c0,false);
          }
          else {
            local_c0 = split_downwards(this,local_c0,uVar31,fanout_tree_depth,&local_98,iVar27 == 3)
            ;
          }
        }
        else if (((this->derived_params_).max_fanout <
                  (local_c0->num_children_ << (fanout_tree_depth & 0x1f)) /
                  (1 << ((this_00->super_AlexNode<int,_int>).duplication_factor_ & 0x1f))) ||
                ((local_c0->super_AlexNode<int,_int>).level_ ==
                 (this->superroot_->super_AlexNode<int,_int>).level_)) {
          local_c0 = split_downwards(this,local_c0,uVar31,fanout_tree_depth,&local_98,iVar27 == 3);
          piVar30 = local_80;
        }
        else {
          split_sideways(this,local_c0,uVar31,fanout_tree_depth,&local_98,iVar27 == 3);
          piVar30 = local_80;
        }
        auVar38._8_8_ = 0;
        auVar38._0_8_ = (local_c0->super_AlexNode<int,_int>).model_.a_;
        auVar41._0_8_ = (double)*piVar30;
        auVar41._8_8_ = in_XMM8_Qb;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = (local_c0->super_AlexNode<int,_int>).model_.b_;
        auVar34 = vfmadd213sd_fma(auVar41,auVar38,auVar10);
        uVar31 = local_c0->num_children_ - 1;
        uVar19 = ~((int)auVar34._0_8_ >> 0x1f) & (int)auVar34._0_8_;
        if ((int)uVar19 <= (int)uVar31) {
          uVar31 = uVar19;
        }
        this_00 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                   *)local_c0->children_[(int)uVar31];
      }
      lVar24 = std::chrono::_V2::system_clock::now();
      (this->stats_).splitting_time = (double)(lVar24 - lVar23) + (this->stats_).splitting_time;
      pVar22 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
               ::insert(this_00,piVar30,local_68);
      if (pVar22.first == -1) {
        local_48.cur_idx_ = pVar22.second;
        local_48.cur_bitmap_idx_ = 0;
        local_48.cur_bitmap_data_ = 0;
        local_48.cur_leaf_ = this_00;
        Iterator::initialize(&local_48);
        ppVar32 = local_70;
        (local_70->first).cur_leaf_ = local_48.cur_leaf_;
        (local_70->first).cur_idx_ = local_48.cur_idx_;
        (local_70->first).cur_bitmap_idx_ = local_48.cur_bitmap_idx_;
        (local_70->first).cur_bitmap_data_ = local_48.cur_bitmap_data_;
        local_70->second = false;
        if (local_98.
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.
                          super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_98.
                                super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.
                                super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        bVar11 = false;
        uVar28 = (ulong)pVar22 >> 0x20;
        goto LAB_00142ff0;
      }
      if (local_98.
          super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.
                        super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    } while (pVar22.first != 0);
    bVar11 = true;
    uVar28 = (ulong)pVar22 >> 0x20;
    ppVar32 = local_70;
  }
  else {
    local_50 = (double)iVar27;
    local_74 = iVar27;
    do {
      auVar35._8_8_ = 0;
      auVar35._0_8_ = ((LinearModel<int> *)&pFVar29->left_boundary)->a_;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_50;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(double *)&pFVar29->use;
      auVar34 = vfmadd213sd_fma(auVar35,auVar39,auVar7);
      uVar31 = *(int *)&pFVar29->a - 1;
      local_58 = auVar34._0_8_;
      uVar19 = ~((int)local_58 >> 0x1f) & (int)local_58;
      if ((int)uVar19 <= (int)uVar31) {
        uVar31 = uVar19;
      }
      local_98.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(local_98.
                             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,uVar31);
      local_98.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_start = pFVar29;
      if (pTStack_b0 == local_a8) {
        std::
        vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
        ::
        _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>
                  ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
                    *)local_b8,(iterator)pTStack_b0,(TraversalNode *)&local_98);
      }
      else {
        pTStack_b0->node = (model_node_type *)pFVar29;
        *(pointer *)&pTStack_b0->bucketID =
             local_98.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pTStack_b0 = pTStack_b0 + 1;
      }
      pTVar17 = pTStack_b0;
      pFVar29 = (pointer)((AlexNode<int,_int> **)pFVar29->b)[(int)uVar31];
    } while (*(bool *)&pFVar29->cost != true);
    plVar1 = &(this->stats_).num_node_lookups;
    *plVar1 = *plVar1 + (long)*(short *)((long)&pFVar29->cost + 2);
    auVar34 = vcvtdq2pd_avx(ZEXT416((uint)(int)(local_58 + 0.5)));
    auVar15._8_8_ = 0x7fffffffffffffff;
    auVar15._0_8_ = 0x7fffffffffffffff;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_58 - auVar34._0_8_;
    auVar33 = vandpd_avx512vl(auVar42,auVar15);
    if (auVar33._0_8_ <= local_58 * 2.220446049250313e-15) {
      if (auVar34._0_8_ <= local_58) {
        lVar23 = *(long *)&pFVar29->num_keys;
        if (lVar23 != 0) {
          uVar28 = (ulong)*(uint *)(lVar23 + 0x58);
          do {
            if ((int)uVar28 < 1) {
              iVar27 = -0x80000000;
              goto LAB_001430a7;
            }
            uVar31 = (int)uVar28 - 1;
            uVar28 = (ulong)uVar31;
          } while ((*(ulong *)(*(long *)(lVar23 + 0x60) + (ulong)(uVar31 >> 6) * 8) >>
                    (uVar28 & 0x3f) & 1) == 0);
          iVar27 = *(int *)(*(long *)(lVar23 + 0x48) + (ulong)uVar31 * 4);
LAB_001430a7:
          if (local_74 <= iVar27) {
            uVar31 = pTStack_b0[-1].bucketID;
            uVar19 = (int)uVar31 % (1 << (*(uint8_t *)((long)&pFVar29->cost + 1) & 0x1f));
            if (uVar31 != uVar19) {
              iVar27 = uVar31 + ~uVar19;
              goto LAB_001432b7;
            }
            pTVar2 = pTStack_b0 + -1;
            pmVar25 = pTVar2->node;
            do {
              pTVar3 = pTStack_b0 + -1;
              bVar12 = (pmVar25->super_AlexNode<int,_int>).duplication_factor_;
              pTVar17[-1].bucketID = pTStack_b0[-2].bucketID;
              pTVar2->node = pTStack_b0[-2].node;
              uVar31 = pTVar17[-1].bucketID;
              uVar19 = (int)uVar31 % (1 << (bVar12 & 0x1f));
              pmVar25 = pTVar17[-1].node;
              pTStack_b0 = pTVar3;
            } while (uVar31 == uVar19);
            iVar27 = uVar31 + ~uVar19;
            pTVar17[-1].bucketID = iVar27;
            pFVar26 = (pointer)pmVar25->children_[iVar27];
            if (*(bool *)&pFVar26->cost == false) {
              do {
                local_98.
                super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)CONCAT44(local_98.
                                       super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                       ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       *(int *)&pFVar26->a + -1);
                local_98.
                super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                ._M_impl.super__Vector_impl_data._M_start = pFVar26;
                if (pTStack_b0 == local_a8) {
                  std::
                  vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
                  ::
                  _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>
                            ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
                              *)local_b8,(iterator)pTStack_b0,(TraversalNode *)&local_98);
                }
                else {
                  pTStack_b0->node = (model_node_type *)pFVar26;
                  *(pointer *)&pTStack_b0->bucketID =
                       local_98.
                       super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  pTStack_b0 = pTStack_b0 + 1;
                }
                pFVar26 = (pointer)((AlexNode<int,_int> **)pFVar26->b)
                                   [(long)*(int *)&pFVar26->a + -1];
              } while (*(bool *)&pFVar26->cost != true);
            }
            if (pFVar26 != *(pointer *)&pFVar29->num_keys) {
              __assert_fail("cur == leaf->prev_leaf_",
                            "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                            ,0x1fc,
                            "void alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::correct_traversal_path(data_node_type *, std::vector<TraversalNode> &, bool) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                           );
            }
          }
        }
      }
      else {
        ppAVar13 = (AlexNode<int,_int> **)pFVar29->b;
        if (ppAVar13 != (AlexNode<int,_int> **)0x0) {
          iVar27 = 0x7fffffff;
          if (0 < *(int *)(ppAVar13 + 0xb)) {
            uVar28 = 0;
            do {
              if (((ulong)(&ppAVar13[0xc]->_vptr_AlexNode)[uVar28 >> 6 & 0x3ffffff] >>
                   (uVar28 & 0x3f) & 1) != 0) {
                iVar27 = *(int *)((long)&ppAVar13[9]->_vptr_AlexNode + uVar28 * 4);
                break;
              }
              uVar28 = uVar28 + 1;
            } while (*(int *)(ppAVar13 + 0xb) != (int)uVar28);
          }
          if (iVar27 <= local_74) {
            pmVar25 = pTStack_b0[-1].node;
            iVar27 = 1 << (*(uint8_t *)((long)&pFVar29->cost + 1) & 0x1f);
            iVar27 = (pTStack_b0[-1].bucketID - pTStack_b0[-1].bucketID % iVar27) + iVar27;
            if (iVar27 == pmVar25->num_children_) {
              pTVar2 = pTStack_b0 + -1;
              do {
                pTVar3 = pTStack_b0 + -1;
                iVar27 = 1 << ((pmVar25->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
                pTVar17[-1].bucketID = pTStack_b0[-2].bucketID;
                pTVar2->node = pTStack_b0[-2].node;
                pmVar25 = pTVar17[-1].node;
                iVar27 = (pTVar17[-1].bucketID + iVar27) - pTVar17[-1].bucketID % iVar27;
                pTStack_b0 = pTVar3;
              } while (iVar27 == pmVar25->num_children_);
              pTVar17[-1].bucketID = iVar27;
              pFVar26 = (pointer)pmVar25->children_[iVar27];
              if (*(bool *)&pFVar26->cost == false) {
                do {
                  local_98.
                  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       (pointer)((ulong)local_98.
                                        super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                        ._M_impl.super__Vector_impl_data._M_finish &
                                0xffffffff00000000);
                  local_98.
                  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                  ._M_impl.super__Vector_impl_data._M_start = pFVar26;
                  if (pTStack_b0 == local_a8) {
                    std::
                    vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
                    ::
                    _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>
                              ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
                                *)local_b8,(iterator)pTStack_b0,(TraversalNode *)&local_98);
                  }
                  else {
                    pTStack_b0->node = (model_node_type *)pFVar26;
                    *(pointer *)&pTStack_b0->bucketID =
                         local_98.
                         super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    pTStack_b0 = pTStack_b0 + 1;
                  }
                  pFVar26 = *(pointer *)pFVar26->b;
                } while (*(bool *)&pFVar26->cost != true);
              }
              if (pFVar26 != (pointer)pFVar29->b) {
                __assert_fail("cur == leaf->next_leaf_",
                              "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                              ,0x217,
                              "void alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::correct_traversal_path(data_node_type *, std::vector<TraversalNode> &, bool) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                             );
              }
            }
            else {
LAB_001432b7:
              pTStack_b0[-1].bucketID = iVar27;
            }
          }
        }
      }
    }
    local_c0 = pTStack_b0[-1].node;
    if (iVar20 != 0) goto LAB_00142bfc;
    bVar11 = true;
    uVar28 = local_60;
    ppVar32 = local_70;
  }
LAB_00142ff0:
  if (local_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_b8,(long)local_a8 - (long)local_b8);
  }
  if (!bVar11) {
    return ppVar32;
  }
LAB_0014300b:
  plVar1 = &(this->stats_).num_inserts;
  *plVar1 = *plVar1 + 1;
  (this->stats_).num_keys = (this->stats_).num_keys + 1;
  pTStack_b0 = (TraversalNode *)(uVar28 & 0xffffffff);
  local_a8 = (pointer)0x0;
  local_b8 = (undefined1  [8])this_00;
  Iterator::initialize((Iterator *)local_b8);
  (ppVar32->first).cur_leaf_ = (data_node_type *)local_b8;
  *(TraversalNode **)&(ppVar32->first).cur_idx_ = pTStack_b0;
  (ppVar32->first).cur_bitmap_data_ = (uint64_t)local_a8;
  ppVar32->second = true;
  return ppVar32;
}

Assistant:

std::pair<Iterator, bool> insert(const T& key, const P& payload) {
    // If enough keys fall outside the key domain, expand the root to expand the
    // key domain
    if (key > istats_.key_domain_max_) {
      istats_.num_keys_above_key_domain++;
      if (should_expand_right()) {
        expand_root(key, false);  // expand to the right
      }
    } else if (key < istats_.key_domain_min_) {
      istats_.num_keys_below_key_domain++;
      if (should_expand_left()) {
        expand_root(key, true);  // expand to the left
      }
    }

    data_node_type* leaf = get_leaf(key);

    // Nonzero fail flag means that the insert did not happen
    std::pair<int, int> ret = leaf->insert(key, payload);
    int fail = ret.first;
    int insert_pos = ret.second;
    if (fail == -1) {
      // Duplicate found and duplicates not allowed
      return {Iterator(leaf, insert_pos), false};
    }

    // If no insert, figure out what to do with the data node to decrease the
    // cost
    if (fail) {
      std::vector<TraversalNode> traversal_path;
      get_leaf(key, &traversal_path);
      model_node_type* parent = traversal_path.back().node;

      while (fail) {
        auto start_time = std::chrono::high_resolution_clock::now();
        stats_.num_expand_and_scales += leaf->num_resizes_;

        if (parent == superroot_) {
          update_superroot_key_domain();
        }
        int bucketID = parent->model_.predict(key);
        bucketID = std::min<int>(std::max<int>(bucketID, 0),
                                 parent->num_children_ - 1);
        std::vector<fanout_tree::FTNode> used_fanout_tree_nodes;

        int fanout_tree_depth = 1;
        if (experimental_params_.splitting_policy_method == 0 || fail >= 2) {
          // always split in 2. No extra work required here
        } else if (experimental_params_.splitting_policy_method == 1) {
          // decide between no split (i.e., expand and retrain) or splitting in
          // 2
          fanout_tree_depth = fanout_tree::find_best_fanout_existing_node<T, P>(
              parent, bucketID, stats_.num_keys, used_fanout_tree_nodes, 2);
        } else if (experimental_params_.splitting_policy_method == 2) {
          // use full fanout tree to decide fanout
          fanout_tree_depth = fanout_tree::find_best_fanout_existing_node<T, P>(
              parent, bucketID, stats_.num_keys, used_fanout_tree_nodes,
              derived_params_.max_fanout);
        }
        int best_fanout = 1 << fanout_tree_depth;
        stats_.cost_computation_time +=
            std::chrono::duration_cast<std::chrono::nanoseconds>(
                std::chrono::high_resolution_clock::now() - start_time)
                .count();

        if (fanout_tree_depth == 0) {
          // expand existing data node and retrain model
          leaf->resize(data_node_type::kMinDensity_, true,
                       leaf->is_append_mostly_right(),
                       leaf->is_append_mostly_left());
          fanout_tree::FTNode& tree_node = used_fanout_tree_nodes[0];
          leaf->cost_ = tree_node.cost;
          leaf->expected_avg_exp_search_iterations_ =
              tree_node.expected_avg_search_iterations;
          leaf->expected_avg_shifts_ = tree_node.expected_avg_shifts;
          leaf->reset_stats();
          stats_.num_expand_and_retrains++;
        } else {
          // split data node: always try to split sideways/upwards, only split
          // downwards if necessary
          bool reuse_model = (fail == 3);
          if (experimental_params_.allow_splitting_upwards) {
            // allow splitting upwards
            assert(experimental_params_.splitting_policy_method != 2);
            int stop_propagation_level = best_split_propagation(traversal_path);
            if (stop_propagation_level <= superroot_->level_) {
              parent = split_downwards(parent, bucketID, fanout_tree_depth,
                                       used_fanout_tree_nodes, reuse_model);
            } else {
              split_upwards(key, stop_propagation_level, traversal_path,
                            reuse_model, &parent);
            }
          } else {
            // either split sideways or downwards
            bool should_split_downwards =
                (parent->num_children_ * best_fanout /
                         (1 << leaf->duplication_factor_) >
                     derived_params_.max_fanout ||
                 parent->level_ == superroot_->level_);
            if (should_split_downwards) {
              parent = split_downwards(parent, bucketID, fanout_tree_depth,
                                       used_fanout_tree_nodes, reuse_model);
            } else {
              split_sideways(parent, bucketID, fanout_tree_depth,
                             used_fanout_tree_nodes, reuse_model);
            }
          }
          leaf = static_cast<data_node_type*>(parent->get_child_node(key));
        }
        auto end_time = std::chrono::high_resolution_clock::now();
        auto duration = end_time - start_time;
        stats_.splitting_time +=
            std::chrono::duration_cast<std::chrono::nanoseconds>(duration)
                .count();

        // Try again to insert the key
        ret = leaf->insert(key, payload);
        fail = ret.first;
        insert_pos = ret.second;
        if (fail == -1) {
          // Duplicate found and duplicates not allowed
          return {Iterator(leaf, insert_pos), false};
        }
      }
    }
    stats_.num_inserts++;
    stats_.num_keys++;
    return {Iterator(leaf, insert_pos), true};
  }